

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O0

bool __thiscall libDAI::TProb<double>::hasNegatives(TProb<double> *this)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  const_reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RDI;
  size_t i;
  bool Negatives;
  undefined8 local_18;
  
  bVar2 = false;
  local_18 = 0;
  while( true ) {
    sVar3 = size((TProb<double> *)0xb45f75);
    bVar1 = 0;
    if (local_18 < sVar3) {
      bVar1 = bVar2 ^ 1;
    }
    if (bVar1 == 0) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_18);
    if (*pvVar4 < 0.0) {
      bVar2 = true;
    }
    local_18 = local_18 + 1;
  }
  return bVar2;
}

Assistant:

bool hasNegatives() const {
                bool Negatives = false;
                for( size_t i = 0; i < size() && !Negatives; i++ ) 
                    if( _p[i] < 0.0 )
                        Negatives = true;
                return Negatives;
            }